

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

int run_test_fs_poll_close_request_multi_start_stop(void)

{
  int iVar1;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_380 [4];
  int i;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init((uv_loop_t *)&poll_handle.poll_ctx);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xe2,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_poll_init((uv_loop_t *)&poll_handle.poll_ctx,(uv_fs_poll_t *)local_380);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0xe4,"uv_fs_poll_init(&loop, &poll_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = 0;
  while( true ) {
    if (9 < eval_a._4_4_) {
      uv_close((uv_handle_t *)local_380,close_cb);
      while (close_cb_called == 0) {
        uv_run((uv_loop_t *)&poll_handle.poll_ctx,UV_RUN_ONCE);
      }
      if ((long)close_cb_called != 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
                ,0xed,"1","==","close_cb_called",1,"==",(long)close_cb_called);
        abort();
      }
      close_loop((uv_loop_t *)&poll_handle.poll_ctx);
      iVar1 = uv_loop_close((uv_loop_t *)&poll_handle.poll_ctx);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
                ,0xef,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
        abort();
      }
      uv_library_shutdown();
      return 0;
    }
    iVar1 = uv_fs_poll_start((uv_fs_poll_t *)local_380,poll_cb_fail,"testfile",100);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
              ,0xe7,"uv_fs_poll_start(&poll_handle, poll_cb_fail, \"testfile\", 100)","==","0",
              (long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_fs_poll_stop((uv_fs_poll_t *)local_380);
    if ((long)iVar1 != 0) break;
    eval_a._4_4_ = eval_a._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
          ,0xe8,"uv_fs_poll_stop(&poll_handle)","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_start_stop) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
    ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}